

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O0

UChar32 __thiscall
icu_63::anon_unknown_0::MutableCodePointTrie::findHighStart(MutableCodePointTrie *this)

{
  int iVar1;
  bool bVar2;
  int local_2c;
  int32_t j;
  uint32_t *p;
  bool match;
  int32_t i;
  MutableCodePointTrie *this_local;
  
  iVar1 = this->highStart >> 4;
  do {
    p._4_4_ = iVar1;
    if (p._4_4_ < 1) {
      return 0;
    }
    iVar1 = p._4_4_ + -1;
    if (this->flags[iVar1] == '\0') {
      bVar2 = this->index[iVar1] == this->highValue;
    }
    else {
      for (local_2c = 0; local_2c != 0x10; local_2c = local_2c + 1) {
        if (this->data[(ulong)this->index[iVar1] + (long)local_2c] != this->highValue) {
          bVar2 = false;
          goto LAB_001ddf71;
        }
      }
      bVar2 = true;
    }
LAB_001ddf71:
    if (!bVar2) {
      return p._4_4_ * 0x10;
    }
  } while( true );
}

Assistant:

UChar32 MutableCodePointTrie::findHighStart() const {
    int32_t i = highStart >> UCPTRIE_SHIFT_3;
    while (i > 0) {
        bool match;
        if (flags[--i] == ALL_SAME) {
            match = index[i] == highValue;
        } else /* MIXED */ {
            const uint32_t *p = data + index[i];
            for (int32_t j = 0;; ++j) {
                if (j == UCPTRIE_SMALL_DATA_BLOCK_LENGTH) {
                    match = true;
                    break;
                }
                if (p[j] != highValue) {
                    match = false;
                    break;
                }
            }
        }
        if (!match) {
            return (i + 1) << UCPTRIE_SHIFT_3;
        }
    }
    return 0;
}